

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_kj::StringPtr,_const_kj::StringPtr>::
ArrayComparisonTest(ArrayComparisonTest<const_kj::StringPtr,_const_kj::StringPtr> *this,
                   initializer_list<const_kj::StringPtr> left,
                   initializer_list<const_kj::StringPtr> right,TestOrdering expectedResult)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  StringPtr *pSVar4;
  StringPtr *end;
  Array<const_kj::StringPtr> *result;
  iterator pSVar5;
  
  pSVar5 = left._M_array;
  end = (StringPtr *)0x0;
  pSVar4 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  sVar1 = (pSVar5->content).size_;
  pcVar2 = pSVar5[1].content.ptr;
  sVar3 = pSVar5[1].content.size_;
  (pSVar4->content).ptr = (pSVar5->content).ptr;
  (pSVar4->content).size_ = sVar1;
  pSVar4[1].content.ptr = pcVar2;
  pSVar4[1].content.size_ = sVar3;
  (this->left).ptr = pSVar4;
  (this->left).size_ = 2;
  (this->left).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  heapArray<kj::StringPtr_const,kj::StringPtr_const*>
            (&this->right,(kj *)left._M_len,
             (StringPtr *)((kj *)left._M_len + (long)right._M_array * 0x10),end);
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}